

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O0

JITTimePolymorphicInlineCacheInfo * __thiscall
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(JITTimeWorkItem *this,intptr_t funcBodyAddr)

{
  void **ppvVar1;
  uint local_24;
  uint i;
  intptr_t funcBodyAddr_local;
  JITTimeWorkItem *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->m_workItemData->inlineeInfoCount <= local_24) {
      return (JITTimePolymorphicInlineCacheInfo *)0x0;
    }
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)
                         &this->m_workItemData->inlineeInfo[local_24].functionBodyAddr);
    if (*ppvVar1 == (void *)funcBodyAddr) break;
    local_24 = local_24 + 1;
  }
  return (JITTimePolymorphicInlineCacheInfo *)(this->m_workItemData->inlineeInfo + local_24);
}

Assistant:

JITTimePolymorphicInlineCacheInfo *
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(intptr_t funcBodyAddr)
{
    for (uint i = 0; i < m_workItemData->inlineeInfoCount; ++i)
    {
        if (m_workItemData->inlineeInfo[i].functionBodyAddr == (void*)funcBodyAddr)
        {
            return (JITTimePolymorphicInlineCacheInfo *)&m_workItemData->inlineeInfo[i];
        }
    }
    return nullptr;
}